

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message_field.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::objectivec::MessageFieldGenerator::WantsHasProperty
          (MessageFieldGenerator *this)

{
  return *(long *)((this->super_ObjCObjFieldGenerator).super_SingleFieldGenerator.
                   super_FieldGenerator.descriptor_ + 0x58) == 0;
}

Assistant:

bool MessageFieldGenerator::WantsHasProperty(void) const {
  if (descriptor_->containing_oneof() != NULL) {
    // If in a oneof, it uses the oneofcase instead of a has bit.
    return false;
  }
  // In both proto2 & proto3, message fields have a has* property to tell
  // when it is a non default value.
  return true;
}